

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O0

void __thiscall
ccs::CcsDomain::CcsDomain(CcsDomain *this,shared_ptr<ccs::CcsLogger> *log,bool logAccesses)

{
  DagBuilder *this_00;
  shared_ptr<ccs::CcsLogger> local_40;
  shared_ptr<ccs::CcsTracer> local_30;
  byte local_19;
  shared_ptr<ccs::CcsLogger> *psStack_18;
  bool logAccesses_local;
  shared_ptr<ccs::CcsLogger> *log_local;
  CcsDomain *this_local;
  
  local_19 = logAccesses;
  psStack_18 = log;
  log_local = (shared_ptr<ccs::CcsLogger> *)this;
  this_00 = (DagBuilder *)operator_new(0x28);
  std::shared_ptr<ccs::CcsLogger>::shared_ptr(&local_40,log);
  CcsTracer::makeLoggingTracer((CcsTracer *)&local_30,&local_40,(bool)(local_19 & 1));
  DagBuilder::DagBuilder(this_00,&local_30);
  std::unique_ptr<ccs::DagBuilder,std::default_delete<ccs::DagBuilder>>::
  unique_ptr<std::default_delete<ccs::DagBuilder>,void>
            ((unique_ptr<ccs::DagBuilder,std::default_delete<ccs::DagBuilder>> *)this,this_00);
  std::shared_ptr<ccs::CcsTracer>::~shared_ptr(&local_30);
  std::shared_ptr<ccs::CcsLogger>::~shared_ptr(&local_40);
  return;
}

Assistant:

CcsDomain::CcsDomain(std::shared_ptr<CcsLogger> log, bool logAccesses) :
  dag(new DagBuilder(CcsTracer::makeLoggingTracer(
    std::move(log), logAccesses))) {}